

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1407::run(TestCase1407 *this)

{
  Builder list;
  DebugExpression<bool> _kjCondition;
  Builder root;
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder;
  ListBuilder local_300;
  PointerBuilder local_2d8;
  Builder local_2c0;
  StructReader local_2a8;
  ListReader local_278;
  StructReader local_248;
  StructBuilder local_218;
  MallocMessageBuilder local_1e8;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_248,&local_f8.super_MessageBuilder);
  local_1e8.super_MessageBuilder.arenaSpace[1] = local_248.data;
  local_1e8.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_248.segment;
  local_1e8.super_MessageBuilder.arenaSpace[0] = local_248.capTable;
  PointerBuilder::getStruct(&local_218,(PointerBuilder *)&local_1e8,(StructSize)0xa0000,(word *)0x0)
  ;
  local_1e8.super_MessageBuilder.arenaSpace[1] = local_218.pointers + 1;
  local_1e8.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_218.segment;
  local_1e8.super_MessageBuilder.arenaSpace[0] = local_218.capTable;
  PointerBuilder::initStructList(&local_300,(PointerBuilder *)&local_1e8,8,(StructSize)0x1);
  ListBuilder::getStructElement((StructBuilder *)&local_1e8,&local_300,0);
  *(byte *)&((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value =
       (byte)((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value | 1;
  ListBuilder::getStructElement((StructBuilder *)&local_1e8,&local_300,1);
  *(byte *)&((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value =
       (byte)((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value | 1;
  ListBuilder::getStructElement((StructBuilder *)&local_1e8,&local_300,2);
  *(byte *)&((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value =
       (byte)((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value & 0xfe;
  ListBuilder::getStructElement((StructBuilder *)&local_1e8,&local_300,3);
  *(byte *)&((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value =
       (byte)((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value | 1;
  ListBuilder::getStructElement((StructBuilder *)&local_1e8,&local_300,4);
  *(byte *)&((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value =
       (byte)((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value | 1;
  ListBuilder::getStructElement((StructBuilder *)&local_1e8,&local_300,5);
  *(byte *)&((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value =
       (byte)((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value & 0xfe;
  ListBuilder::getStructElement((StructBuilder *)&local_1e8,&local_300,6);
  *(byte *)&((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value =
       (byte)((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value | 1;
  ListBuilder::getStructElement((StructBuilder *)&local_1e8,&local_300,7);
  *(byte *)&((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value =
       (byte)((WireValue<uint32_t> *)local_1e8.super_MessageBuilder.arenaSpace[1])->value & 0xfe;
  MallocMessageBuilder::MallocMessageBuilder(&local_1e8,0x400,GROW_HEURISTICALLY);
  ListBuilder::asReader(&local_300);
  ListReader::getStructElement(&local_2a8,&local_278,2);
  MessageBuilder::getRootInternal(&local_2c0,&local_1e8.super_MessageBuilder);
  local_248.dataSize = local_2a8.dataSize;
  local_248.pointerCount = local_2a8.pointerCount;
  local_248._38_2_ = local_2a8._38_2_;
  local_248.nestingLimit = local_2a8.nestingLimit;
  local_248._44_4_ = local_2a8._44_4_;
  local_248.data = local_2a8.data;
  local_248.pointers = local_2a8.pointers;
  local_248.segment = local_2a8.segment;
  local_248.capTable = local_2a8.capTable;
  local_2d8.pointer = local_2c0.builder.pointer;
  local_2d8.segment = local_2c0.builder.segment;
  local_2d8.capTable = local_2c0.builder.capTable;
  PointerBuilder::setStruct(&local_2d8,&local_248,false);
  MessageBuilder::getRootInternal((Builder *)&local_278,&local_1e8.super_MessageBuilder);
  local_2a8.data = local_278.ptr;
  local_2a8.segment = local_278.segment;
  local_2a8.capTable = local_278.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_248,(PointerBuilder *)&local_2a8,(StructSize)0x1,(word *)0x0);
  local_2d8.segment =
       (SegmentBuilder *)
       (CONCAT71(local_2d8.segment._1_7_,*local_248.data) & 0xffffffffffffff01 ^ 1);
  if (((*local_248.data & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[72],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x590,ERROR,
               "\"failed: expected \" \"!(builder2.getRoot<test::TestLists::Struct1>().getF())\", _kjCondition"
               ,(char (*) [72])
                "failed: expected !(builder2.getRoot<test::TestLists::Struct1>().getF())",
               (DebugExpression<bool> *)&local_2d8);
  }
  ListBuilder::asReader(&local_300);
  ListReader::getStructElement(&local_2a8,&local_278,6);
  MessageBuilder::getRootInternal(&local_2c0,&local_1e8.super_MessageBuilder);
  local_248.dataSize = local_2a8.dataSize;
  local_248.pointerCount = local_2a8.pointerCount;
  local_248._38_2_ = local_2a8._38_2_;
  local_248.nestingLimit = local_2a8.nestingLimit;
  local_248._44_4_ = local_2a8._44_4_;
  local_248.data = local_2a8.data;
  local_248.pointers = local_2a8.pointers;
  local_248.segment = local_2a8.segment;
  local_248.capTable = local_2a8.capTable;
  local_2d8.pointer = local_2c0.builder.pointer;
  local_2d8.segment = local_2c0.builder.segment;
  local_2d8.capTable = local_2c0.builder.capTable;
  PointerBuilder::setStruct(&local_2d8,&local_248,false);
  MessageBuilder::getRootInternal((Builder *)&local_278,&local_1e8.super_MessageBuilder);
  local_2a8.data = local_278.ptr;
  local_2a8.segment = local_278.segment;
  local_2a8.capTable = local_278.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_248,(PointerBuilder *)&local_2a8,(StructSize)0x1,(word *)0x0);
  local_2d8.segment =
       (SegmentBuilder *)(CONCAT71(local_2d8.segment._1_7_,*local_248.data) & 0xffffffffffffff01);
  if (((*local_248.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[69],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x592,ERROR,
               "\"failed: expected \" \"builder2.getRoot<test::TestLists::Struct1>().getF()\", _kjCondition"
               ,(char (*) [69])
                "failed: expected builder2.getRoot<test::TestLists::Struct1>().getF()",
               (DebugExpression<bool> *)&local_2d8);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_1e8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Encoding, OneBitStructSetters) {
  // Test case of setting a 1-bit struct.

  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestLists>();
  auto list = root.initList1(8);
  list[0].setF(true);
  list[1].setF(true);
  list[2].setF(false);
  list[3].setF(true);
  list[4].setF(true);
  list[5].setF(false);
  list[6].setF(true);
  list[7].setF(false);

  MallocMessageBuilder builder2;
  builder2.setRoot(list.asReader()[2]);
  EXPECT_FALSE(builder2.getRoot<test::TestLists::Struct1>().getF());
  builder2.setRoot(list.asReader()[6]);
  EXPECT_TRUE(builder2.getRoot<test::TestLists::Struct1>().getF());
}